

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O3

int __thiscall amrex::BndryData::init(BndryData *this,EVP_PKEY_CTX *ctx)

{
  Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *this_00;
  FabArray<amrex::Mask> *pFVar1;
  FabArray<amrex::Mask> *pFVar2;
  long lVar3;
  int extraout_EAX;
  FabArray<amrex::Mask> *this_01;
  long lVar4;
  
  memcpy(&this->geom,ctx + 0xba8,200);
  this->m_ncomp = *(int *)(ctx + 0xc70);
  this->m_defined = (bool)ctx[0xc74];
  LayoutData<std::array<double,_6UL>_>::operator=
            (&this->bcloc,(LayoutData<std::array<double,_6UL>_> *)(ctx + 0xa80));
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::operator=(&this->bcond,
              (LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
               *)(ctx + 0x970));
  this_00 = &this->masks;
  pFVar1 = &((this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
             super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
             super__Vector_impl_data._M_start)->m_fa;
  pFVar2 = &((this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
             super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
             super__Vector_impl_data._M_finish)->m_fa;
  this_01 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      FabArray<amrex::Mask>::~FabArray(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pFVar2);
    (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
    super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pFVar1;
  }
  std::vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::resize
            (&this_00->super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>,6);
  lVar4 = 0;
  do {
    lVar3 = *(long *)(ctx + 0xb90);
    MultiMask::define((MultiMask *)
                      ((long)&(((this_00->
                                super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>).
                                super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_fa).super_FabArrayBase
                      + lVar4),(BoxArray *)(lVar3 + lVar4 + 8),
                      (DistributionMapping *)(lVar3 + lVar4 + 0x70),*(int *)(lVar3 + lVar4 + 0xcc));
    MultiMask::Copy((MultiMask *)
                    ((long)&(((this_00->
                              super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>).
                              super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_fa).super_FabArrayBase +
                    lVar4),(MultiMask *)(lVar3 + lVar4));
    lVar4 = lVar4 + 0x180;
  } while (lVar4 != 0x900);
  return extraout_EAX;
}

Assistant:

void
BndryData::init (const BndryData& src)
{
    geom      = src.geom;
    m_ncomp   = src.m_ncomp;
    m_defined = src.m_defined;
    bcloc     = src.bcloc;
    bcond     = src.bcond;

    masks.clear();
    masks.resize(2*AMREX_SPACEDIM);
    for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
    {
        const MultiMask& smasks = src.masks[i];
        masks[i].define(smasks.boxArray(), smasks.DistributionMap(), smasks.nComp());
        MultiMask::Copy(masks[i], smasks);
    }
}